

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,void *ptr)

{
  Int IVar1;
  QTextStreamPrivate *this_00;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *unaff_retaddr;
  int oldBase;
  QTextStreamPrivate *d;
  NumberFlags oldFlags;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar2;
  QTextStream *local_38;
  undefined1 in_stack_fffffffffffffff7;
  qulonglong number;
  
  number = *(qulonglong *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextStream *)0x4ad15f);
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff98);
    QMessageLogger::warning((QMessageLogger *)&stack0xffffffffffffffd8,"QTextStream: No device");
    local_38 = in_RDI;
  }
  else {
    iVar2 = (this_00->params).integerBase;
    IVar1 = (this_00->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
            super_QFlagsStorage<QTextStream::NumberFlag>.i;
    (this_00->params).integerBase = 0x10;
    QFlags<QTextStream::NumberFlag>::operator|=(&(this_00->params).numberFlags,ShowBase);
    QTextStreamPrivate::putNumber(unaff_retaddr,number,(bool)in_stack_fffffffffffffff7);
    (this_00->params).integerBase = iVar2;
    (this_00->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
    super_QFlagsStorage<QTextStream::NumberFlag>.i = IVar1;
    local_38 = in_RDI;
  }
  if (*(qulonglong *)(in_FS_OFFSET + 0x28) == number) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(const void *ptr)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    const int oldBase = d->params.integerBase;
    const NumberFlags oldFlags = d->params.numberFlags;
    d->params.integerBase = 16;
    d->params.numberFlags |= ShowBase;
    d->putNumber(reinterpret_cast<quintptr>(ptr), false);
    d->params.integerBase = oldBase;
    d->params.numberFlags = oldFlags;
    return *this;
}